

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceNextGenBase.hpp
# Opt level: O0

void __thiscall
Diligent::
RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
::PurgeReleaseQueue(RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                    *this,SoftwareQueueIndex QueueInd,bool ForceRelease)

{
  CommandQueue *pCVar1;
  Uint32 UVar2;
  int iVar3;
  Char *Message;
  ICommandQueueVk *pIVar4;
  undefined4 extraout_var;
  Uint64 local_80;
  unsigned_long CompletedFenceValue;
  CommandQueue *Queue;
  undefined1 local_40 [8];
  string msg;
  bool ForceRelease_local;
  RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
  *this_local;
  SoftwareQueueIndex QueueInd_local;
  
  msg.field_2._M_local_buf[0xf] = ForceRelease;
  this_local._7_1_ = QueueInd.m_Value;
  UVar2 = IndexWrapper::operator_cast_to_unsigned_int((IndexWrapper *)((long)&this_local + 7));
  if (this->m_CmdQueueCount <= (ulong)UVar2) {
    FormatString<char[26],char[27]>
              ((string *)local_40,(Diligent *)"Debug expression failed:\n",(char (*) [26])0xe38e79,
               (char (*) [27])this);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"PurgeReleaseQueue",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineNextGenBase/include/RenderDeviceNextGenBase.hpp"
               ,0x99);
    std::__cxx11::string::~string((string *)local_40);
  }
  pCVar1 = this->m_CommandQueues;
  UVar2 = IndexWrapper::operator_cast_to_unsigned_int((IndexWrapper *)((long)&this_local + 7));
  if ((msg.field_2._M_local_buf[0xf] & 1U) == 0) {
    pIVar4 = RefCntAutoPtr<Diligent::ICommandQueueVk>::operator->(&pCVar1[UVar2].CmdQueue);
    iVar3 = (*(pIVar4->super_ICommandQueue).super_IObject._vptr_IObject[5])();
    local_80 = CONCAT44(extraout_var,iVar3);
  }
  else {
    local_80 = std::numeric_limits<unsigned_long>::max();
  }
  ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper>::Purge
            (&pCVar1[UVar2].ReleaseQueue,local_80);
  return;
}

Assistant:

void PurgeReleaseQueue(SoftwareQueueIndex QueueInd, bool ForceRelease = false)
    {
        VERIFY_EXPR(QueueInd < m_CmdQueueCount);
        auto& Queue               = m_CommandQueues[QueueInd];
        auto  CompletedFenceValue = ForceRelease ? std::numeric_limits<Uint64>::max() : Queue.CmdQueue->GetCompletedFenceValue();
        Queue.ReleaseQueue.Purge(CompletedFenceValue);
    }